

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

bool __thiscall QVariant::convert(QVariant *this,QMetaType targetType)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  QMetaType toType;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  QVariant *to;
  QMetaTypeInterface *iface;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  long in_FS_OFFSET;
  QMetaType local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.shared = (PrivateShared *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  local_80.d_ptr = targetType.d_ptr;
  bVar4 = ::comparesEqual((QMetaType *)&local_50.shared,&local_80);
  if (bVar4) {
    bVar4 = local_80.d_ptr != (QMetaTypeInterface *)0x0;
    goto LAB_002d5b38;
  }
  this_00 = &local_78;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVariant((QVariant *)this_00,this);
  clear(this);
  fromMetaType((QVariant *)&local_50,local_80,(void *)0x0);
  operator=(this,(QVariant *)&local_50);
  ~QVariant((QVariant *)&local_50);
  bVar4 = QMetaType::canConvert
                    ((QMetaTypeInterface *)((ulong)puStack_60 & 0xfffffffffffffffc),local_80);
  if (bVar4) {
    if (((ulong)puStack_60 & 2) != 0) {
      iface = (QMetaTypeInterface *)((ulong)puStack_60 & 0xfffffffffffffffc);
      if (iface == (QMetaTypeInterface *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = (iface->typeId)._q_value.super___atomic_base<int>._M_i;
        if (iVar5 == 0) {
          iVar5 = QMetaType::registerHelper(iface);
        }
      }
      if (iVar5 != 0x33) goto LAB_002d5b2c;
    }
    puVar3 = puStack_60;
    toType.d_ptr = local_80.d_ptr;
    if (((ulong)puStack_60 & 1) != 0) {
      this_00 = (anon_union_24_3_e3d07ef4_for_data *)
                ((long)&((local_78.shared)->ref).super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                (long)(local_78.shared)->offset);
    }
    detach(this);
    uVar1 = *(ulong *)&(this->d).field_0x18;
    *(ulong *)&(this->d).field_0x18 = uVar1 & 0xfffffffffffffffd;
    to = this;
    if ((uVar1 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      to = (QVariant *)
           ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int> + (long)pPVar2->offset);
    }
    bVar4 = QMetaType::convert((QMetaTypeInterface *)((ulong)puVar3 & 0xfffffffffffffffc),this_00,
                               toType,to);
    *(ulong *)&(this->d).field_0x18 =
         (*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffd) + (ulong)!bVar4 * 2;
  }
  else {
LAB_002d5b2c:
    bVar4 = false;
  }
  ~QVariant((QVariant *)&local_78);
LAB_002d5b38:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::convert(QMetaType targetType)
{
    if (d.type() == targetType)
        return targetType.isValid();

    QVariant oldValue = *this;

    clear();
    create(targetType, nullptr);
    if (!oldValue.canConvert(targetType))
        return false;

    // Fail if the value is not initialized or was forced null by a previous failed convert.
    if (oldValue.d.is_null && oldValue.d.type().id() != QMetaType::Nullptr)
        return false;

    bool ok = QMetaType::convert(oldValue.d.type(), oldValue.constData(), targetType, data());
    d.is_null = !ok;
    return ok;
}